

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::localReturnValue(StackInterpreter *this,Oop value)

{
  long lVar1;
  size_t sVar2;
  StackMemory *pSVar3;
  long *plVar4;
  
  pSVar3 = this->stack;
  plVar4 = (long *)(pSVar3->stackFrame).framePointer;
  if (*plVar4 != 0) {
    if (*(char *)((long)plVar4 + -0xe) != '\0') {
      lVar1 = plVar4[-3];
      *(undefined8 **)(lVar1 + 8) = &NilObject;
      *(undefined8 **)(lVar1 + 0x10) = &NilObject;
      *(undefined8 *)(lVar1 + 0x18) = 1;
      pSVar3 = this->stack;
      plVar4 = (long *)(pSVar3->stackFrame).framePointer;
    }
    (pSVar3->stackFrame).stackPointer = (uint8_t *)plVar4;
    (pSVar3->stackFrame).framePointer = (uint8_t *)*plVar4;
    this->pc = plVar4[1];
    sVar2 = this->argumentCount;
    (pSVar3->stackFrame).stackPointer = (uint8_t *)(plVar4 + sVar2 + 2);
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(plVar4 + sVar2 + 2) = value.field_0;
    fetchFrameData(this);
    sVar2 = this->pc;
    if (sVar2 != 0) {
      this->pc = sVar2 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar2);
    }
    return;
  }
  baseReturnValue(this,value);
  return;
}

Assistant:

void localReturnValue(Oop value)
    {
        auto prevFramePointer = stack->getPrevFramePointer();
        if (prevFramePointer == nullptr)
        {
            return baseReturnValue(value);
        }

        // Widow the current context.
        if (stack->getCurrentFrame().hasContext())
            widowContext(reinterpret_cast<Context*> (stack->getThisContext().pointer));

        // Restore the stack into beginning of the frame pointer.
		stack->setStackPointer(stack->getFramePointer());
		stack->setFramePointer(stack->popPointer());

		// Pop the return pc
		popPC();

		// Pop the arguments and the receiver.
		popMultiplesOops(argumentCount + 1);

		// Push the return value.
		pushOop(value);

        // Re fetch the frame data to continue.
        fetchFrameData();

		// If there is no pc, then it means that we are returning.
		if(pc)
		{
			// Fetch the next instruction
			fetchNextInstructionOpcode();
		}
    }